

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  char cVar1;
  int iVar2;
  int iVar3;
  ConcreteAggregate *this;
  undefined4 extraout_var;
  char *__assertion;
  long *plVar4;
  
  this = (ConcreteAggregate *)operator_new(0x18);
  ConcreteAggregate::ConcreteAggregate(this,5);
  iVar2 = (**(this->super_Aggregate)._vptr_Aggregate)(this);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = 0;
  do {
    cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (cVar1 != '\0') {
      (**(code **)*plVar4)(plVar4);
      iVar2 = (**(code **)(*plVar4 + 0x18))(plVar4);
      if (iVar2 == 0) {
        return 0;
      }
      __assertion = "value == 0";
      __line = 0x15;
LAB_00101207:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/iterator_test.cc"
                    ,__line,"int main()");
    }
    iVar3 = (*(code *)((undefined8 *)*plVar4)[3])();
    if (iVar2 != iVar3) {
      __assertion = "value == i";
      __line = 0xe;
      goto LAB_00101207;
    }
    iVar2 = iVar2 + 1;
    (**(code **)(*plVar4 + 8))(plVar4);
  } while( true );
}

Assistant:

int main() {
  ConcreteAggregate* list = new ConcreteAggregate(5);
  Iterator* iterator = list->createIterator();
  int value;

  for (int i = 0; !iterator->isDone(); iterator->next()) {
    value = iterator->currentItem();
    assert(value == i);
    i++;
  }

  iterator->first();

  value = iterator->currentItem();
  assert(value == 0);
}